

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O2

size_t __thiscall
ADynamicLight::PointerSubstitution(ADynamicLight *this,DObject *old,DObject *notOld)

{
  TObjPtr<AActor> *obj;
  AActor *pAVar1;
  size_t sVar2;
  
  obj = &(this->super_AActor).target;
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
  sVar2 = DObject::PointerSubstitution((DObject *)this,old,notOld);
  if (notOld != (DObject *)0x0) {
    (obj->field_0).p = pAVar1;
  }
  return sVar2;
}

Assistant:

size_t ADynamicLight::PointerSubstitution (DObject *old, DObject *notOld)
{
	AActor *saved_target = target;
	size_t ret = Super::PointerSubstitution(old, notOld);
	if (notOld != NULL) target = saved_target;
	return ret;
}